

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_format.cpp
# Opt level: O3

void __thiscall csv::CSVFormat::assert_no_char_overlap(CSVFormat *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined1 uVar3;
  char cVar4;
  runtime_error *this_00;
  ulong uVar5;
  _Base_ptr p_Var6;
  char *__args;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  ulong uVar9;
  string err_msg;
  set<char,_std::less<char>,_std::allocator<char>_> trims;
  set<char,_std::less<char>,_std::allocator<char>_> delims;
  char *local_e8;
  iterator iStack_e0;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_90;
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_60;
  
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_60,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->possible_delimiters).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((set<char,std::less<char>,std::allocator<char>> *)&local_90,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
             (this->trim_chars).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_e8 = (char *)0x0;
  iStack_e0._M_current = (char *)0x0;
  local_d8 = (char *)0x0;
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
  std::
  __set_intersection<std::_Rb_tree_const_iterator<char>,std::_Rb_tree_const_iterator<char>,std::back_insert_iterator<std::vector<char,std::allocator<char>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var2,
             local_90._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1);
  __args = &this->quote_char;
  if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_001062bf:
    if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0)
    goto LAB_00106323;
    cVar4 = *__args;
    p_Var8 = &p_Var1->_M_header;
    do {
      p_Var7 = p_Var8;
      p_Var6 = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      uVar3 = (undefined1)p_Var6[1]._M_color;
      p_Var8 = p_Var6;
      if ((char)uVar3 < cVar4) {
        p_Var8 = p_Var7;
      }
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var6->_M_left)[(char)uVar3 < cVar4];
    } while ((&p_Var6->_M_left)[(char)uVar3 < cVar4] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var8 == p_Var1) goto LAB_00106323;
    if ((char)uVar3 < cVar4) {
      p_Var6 = p_Var7;
    }
    if (cVar4 < (char)p_Var6[1]._M_color) goto LAB_00106323;
  }
  else {
    cVar4 = *__args;
    p_Var8 = &p_Var2->_M_header;
    do {
      p_Var7 = p_Var8;
      p_Var6 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      uVar3 = (undefined1)p_Var6[1]._M_color;
      p_Var8 = p_Var6;
      if ((char)uVar3 < cVar4) {
        p_Var8 = p_Var7;
      }
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&p_Var6->_M_left)[(char)uVar3 < cVar4];
    } while ((&p_Var6->_M_left)[(char)uVar3 < cVar4] != (_Base_ptr)0x0);
    if ((_Rb_tree_header *)p_Var8 == p_Var2) goto LAB_001062bf;
    if ((char)uVar3 < cVar4) {
      p_Var6 = p_Var7;
    }
    if (cVar4 < (char)p_Var6[1]._M_color) goto LAB_001062bf;
  }
  if (iStack_e0._M_current == local_d8) {
    std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
              ((vector<char,std::allocator<char>> *)&local_e8,iStack_e0,__args);
  }
  else {
    *iStack_e0._M_current = cVar4;
    iStack_e0._M_current = iStack_e0._M_current + 1;
  }
LAB_00106323:
  if (local_e8 != iStack_e0._M_current) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,
               "There should be no overlap between the quote character, the set of possible delimiters and the set of whitespace characters. Offending characters: "
               ,"");
    if (iStack_e0._M_current != local_e8) {
      uVar9 = 0;
      do {
        std::__cxx11::string::append((char *)&local_d0);
        std::__cxx11::string::push_back((char)&local_d0);
        std::__cxx11::string::append((char *)&local_d0);
        uVar9 = uVar9 + 1;
        uVar5 = (long)iStack_e0._M_current - (long)local_e8;
        if (uVar9 < uVar5) {
          std::__cxx11::string::append((char *)&local_d0);
          uVar5 = (long)iStack_e0._M_current - (long)local_e8;
        }
      } while (uVar9 < uVar5);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_b0,&local_d0,'.');
    std::runtime_error::runtime_error(this_00,(string *)&local_b0);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_e8 != (char *)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_90);
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

CSV_INLINE void CSVFormat::assert_no_char_overlap()
    {
        auto delims = std::set<char>(
            this->possible_delimiters.begin(), this->possible_delimiters.end()),
            trims = std::set<char>(
                this->trim_chars.begin(), this->trim_chars.end());

        // Stores intersection of possible delimiters and trim characters
        std::vector<char> intersection = {};

        // Find which characters overlap, if any
        std::set_intersection(
            delims.begin(), delims.end(),
            trims.begin(), trims.end(),
            std::back_inserter(intersection));

        // Make sure quote character is not contained in possible delimiters
        // or whitespace characters
        if (delims.find(this->quote_char) != delims.end() ||
            trims.find(this->quote_char) != trims.end()) {
            intersection.push_back(this->quote_char);
        }

        if (!intersection.empty()) {
            std::string err_msg = "There should be no overlap between the quote character, "
                "the set of possible delimiters "
                "and the set of whitespace characters. Offending characters: ";

            // Create a pretty error message with the list of overlapping
            // characters
            for (size_t i = 0; i < intersection.size(); i++) {
                err_msg += "'";
                err_msg += intersection[i];
                err_msg += "'";

                if (i + 1 < intersection.size())
                    err_msg += ", ";
            }

            throw std::runtime_error(err_msg + '.');
        }
    }